

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseVisibilityTest_Edition2024NoServiceVisibility_Test
::TestBody(ParseVisibilityTest_Edition2024NoServiceVisibility_Test *this)

{
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_38
  ;
  string_view local_20;
  ParseVisibilityTest_Edition2024NoServiceVisibility_Test *local_10;
  ParseVisibilityTest_Edition2024NoServiceVisibility_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,
             "\n        edition = \"2024\";\n        local service Foo {\n        }\n        ");
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_38,
            "2:14: \'local\' and \'export\' visibility modifiers are valid only on \'message\' and \'enum\'\n"
           );
  ParserTest::ExpectHasErrors(&this->super_ParseVisibilityTest,local_20,&local_38);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_38);
  return;
}

Assistant:

TEST_F(ParseVisibilityTest, Edition2024NoServiceVisibility) {
  ExpectHasErrors(
      R"schema(
        edition = "2024";
        local service Foo {
        }
        )schema",
      "2:14: 'local' and 'export' visibility modifiers are valid only on "
      "'message' and 'enum'\n");
}